

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
          (ConfidentialTxInReference *this,ConfidentialTxIn *tx_in)

{
  AbstractTxInReference::AbstractTxInReference
            (&this->super_AbstractTxInReference,&tx_in->super_AbstractTxIn);
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__ConfidentialTxInReference_006494d0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->blinding_nonce_,
             &(tx_in->blinding_nonce_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->asset_entropy_,
             &(tx_in->asset_entropy_).data_);
  ConfidentialValue::ConfidentialValue(&this->issuance_amount_,&tx_in->issuance_amount_);
  ConfidentialValue::ConfidentialValue(&this->inflation_keys_,&tx_in->inflation_keys_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &this->issuance_amount_rangeproof_,&(tx_in->issuance_amount_rangeproof_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &this->inflation_keys_rangeproof_,&(tx_in->inflation_keys_rangeproof_).data_);
  ScriptWitness::ScriptWitness(&this->pegin_witness_,&tx_in->pegin_witness_);
  return;
}

Assistant:

ConfidentialTxInReference::ConfidentialTxInReference(
    const ConfidentialTxIn &tx_in)
    : AbstractTxInReference(tx_in),
      blinding_nonce_(tx_in.GetBlindingNonce()),
      asset_entropy_(tx_in.GetAssetEntropy()),
      issuance_amount_(tx_in.GetIssuanceAmount()),
      inflation_keys_(tx_in.GetInflationKeys()),
      issuance_amount_rangeproof_(tx_in.GetIssuanceAmountRangeproof()),
      inflation_keys_rangeproof_(tx_in.GetInflationKeysRangeproof()),
      pegin_witness_(tx_in.GetPeginWitness()) {
  // do nothing
}